

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.c
# Opt level: O3

sexp sexp_callback_remap(sexp ctx,sexp s,void *user)

{
  long lVar1;
  long lVar2;
  long lVar3;
  sexp psVar4;
  long lVar5;
  size_t __n;
  
  __n = 0x20;
  if (((ulong)s & 3) == 0) {
    psVar4 = (ctx->value).type.setters;
    if ((ulong)s->tag < (ulong)((long)(psVar4->value).type.id >> 1)) {
      lVar1 = *(long *)((long)&((psVar4->value).type.getters)->value + (ulong)s->tag * 8 + 8);
      __n = (long)*(short *)(lVar1 + 0x5e) +
            (ulong)*(ushort *)(lVar1 + 0x62) *
            *(long *)((long)&s->tag + (long)*(short *)(lVar1 + 0x60)) + 0x1f & 0xffffffffffffffe0;
    }
  }
  if (*(void **)((long)user + 0x20) < *(void **)((long)user + 0x28)) {
    memcpy(*(void **)((long)user + 0x20),s,__n);
    lVar1 = *user;
    lVar2 = *(long *)((long)user + 0x50);
    lVar5 = lVar1 * 0x10;
    *(sexp *)(lVar2 + lVar5) = s;
    lVar3 = *(long *)((long)user + 0x20);
    *(long *)(lVar2 + 8 + lVar5) = lVar3;
    if (ctx == s) {
      *(long *)((long)user + 0x38) = lVar3;
    }
    *(size_t *)((long)user + 0x20) = lVar3 + __n;
    *(long *)user = lVar1 + 1;
    psVar4 = (sexp)&DAT_0000013e;
  }
  else {
    snprintf(gc_heap_err_str,0x100,"callback_remap i=%zu p>end internal error",*user);
    psVar4 = (sexp)&DAT_0000003e;
  }
  return psVar4;
}

Assistant:

static sexp sexp_callback_remap(sexp ctx, sexp s, void *user) {
  struct sexp_remap_state* state = user;
  size_t size = sexp_gc_allocated_bytes(ctx, sexp_context_types(ctx),
                                        sexp_context_num_types(ctx), s);
  if (state->p >= state->end) {
    snprintf(gc_heap_err_str, ERR_STR_SIZE, "callback_remap i=%zu p>end internal error", state->index);
    return SEXP_FALSE; }
  memcpy(state->p, s, size);
  
  state->remap[state->index].srcp = s;
  state->remap[state->index].dstp = state->p;
  if (ctx == s) state->ctx_dst = state->p;
  
  state->p = (sexp)(((unsigned char*)state->p) + size);
  state->index += 1;

  return SEXP_TRUE;
}